

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_exception_handler_test.cpp
# Opt level: O2

void __thiscall
StdExceptionCatcher_Tests::std_exception_catcher_catches_bad_alloc_exception::test_method
          (std_exception_catcher_catches_bad_alloc_exception *this)

{
  GenericExceptionHandler<std::exception,_mittens::UnHandler<int>,_mittens::DefaultNoAction<std::exception>_>
  catcher;
  
  throw_bad_alloc();
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(std_exception_catcher_catches_bad_alloc_exception)
{
   auto catcher = std_exception_handler(EXIT_FAILURE, UnHandler<int>());
   try
   {
      throw_bad_alloc();
   }
   catch (...)
   {
      BOOST_CHECK_EQUAL(EXIT_FAILURE, catcher.handleException());
   }
}